

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_server.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  string_view key;
  string_view value;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<AutoReconnectConnection,_std::allocator<AutoReconnectConnection>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_1588;
  io_service service;
  undefined1 local_1568 [48];
  shared_ptr<mini_bus::ConnectionInfo> local_1538;
  endpoint local_1524;
  undefined8 local_1508;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1500;
  MiniBusClient client;
  
  boost::asio::io_context::io_context(&service);
  boost::asio::ip::make_address((address *)(local_1568 + 0x10),"127.0.0.1");
  boost::asio::ip::detail::endpoint::endpoint(&local_1524,(address *)(local_1568 + 0x10),0xfc8);
  p_Var1 = std::
           allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<AutoReconnectConnection,_std::allocator<AutoReconnectConnection>,_(__gnu_cxx::_Lock_policy)2>_>_>
           ::allocate(&__a2,1);
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0011e7b0;
  client.is_running._M_base._M_i = (__atomic_base<bool>)0x0;
  client._1_7_ = 0;
  client.info.super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  client.rd.field_0.field_0._M_file =
       std::
       _Function_handler<void_(mini_bus::MiniBusClient_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/codehz[P]mini_bus_cpp/src/demo_server.cpp:46:86)>
       ::_M_invoke;
  client.info.super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          std::
          _Function_handler<void_(mini_bus::MiniBusClient_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/codehz[P]mini_bus_cpp/src/demo_server.cpp:46:86)>
          ::_M_manager;
  local_1588._M_alloc = &__a2;
  local_1588._M_ptr = p_Var1;
  AutoReconnectConnection::AutoReconnectConnection
            ((AutoReconnectConnection *)&p_Var1->_M_impl,&service,(endpoint *)&local_1524,
             (seconds)0x5,(function<void_(mini_bus::MiniBusClient_&)> *)&client);
  std::_Function_base::~_Function_base((_Function_base *)&client);
  local_1588._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<AutoReconnectConnection,_std::allocator<AutoReconnectConnection>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_1588);
  local_1508 = 0;
  _Stack_1500._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1538.super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&p_Var1->_M_impl;
  local_1538.super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = &p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
  mini_bus::MiniBusClient::MiniBusClient(&client,&local_1538);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1538.super___shared_ptr<mini_bus::ConnectionInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1500);
  do {
    local_1568._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>
              ((duration<long,_std::ratio<1L,_1L>_> *)(local_1568 + 0x10));
    key._M_str = (char *)0x5;
    key._M_len = (size_t)&client;
    value._M_str = (char *)0x6;
    value._M_len = (size_t)"event";
    mini_bus::MiniBusClient::notify((MiniBusClient *)local_1568,key,value);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1568 + 8));
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
  using namespace std::chrono_literals;
  try {
    io_service service;
    MiniBusClient client{std::make_shared<AutoReconnectConnection>(
        service, ip::tcp::endpoint{ip::address::from_string("127.0.0.1"), 4040}, 5s, [](MiniBusClient &client) {
          client.register_handler("echo", [](auto inp) { return std::string{inp}; });
          client.set("registry", "demo", "(value will be ignored)")->wait();
          client.set_private("key", "value")->wait();
        })};
    while (true) {
      std::this_thread::sleep_for(1s);
      try {
        client.notify("event", "notify");
      } catch (...) {
        std::cout << "failed to send notify" << std::endl;
      }
    }
  } catch (std::exception &e) { std::cout << e.what() << std::endl; }
}